

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ipstats.cpp
# Opt level: O0

bool __thiscall IPStats::SaveToCsv(IPStats *this,char *file_name)

{
  uint32_t uVar1;
  reference ppIVar2;
  iterator __first;
  iterator __last;
  size_type sVar3;
  ulong local_88;
  size_t i_1;
  IPStatsRecord *local_70;
  IPStatsRecord *record;
  size_type sStack_60;
  uint32_t i;
  size_t record_index;
  allocator<IPStatsRecord_*> local_41;
  undefined1 local_40 [8];
  vector<IPStatsRecord_*,_std::allocator<IPStatsRecord_*>_> records;
  FILE *F;
  int last_err;
  bool ret;
  char *file_name_local;
  IPStats *this_local;
  
  F._7_1_ = 1;
  F._0_4_ = 0;
  _last_err = file_name;
  file_name_local = (char *)this;
  records.super__Vector_base<IPStatsRecord_*,_std::allocator<IPStatsRecord_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)ithi_file_open_ex(file_name,"wt",(int *)&F);
  if ((FILE *)records.super__Vector_base<IPStatsRecord_*,_std::allocator<IPStatsRecord_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage == (FILE *)0x0) {
    F._7_1_ = 0;
  }
  else {
    uVar1 = BinHash<IPStatsRecord>::GetCount(&this->ip_records);
    std::allocator<IPStatsRecord_*>::allocator(&local_41);
    std::vector<IPStatsRecord_*,_std::allocator<IPStatsRecord_*>_>::vector
              ((vector<IPStatsRecord_*,_std::allocator<IPStatsRecord_*>_> *)local_40,(ulong)uVar1,
               &local_41);
    std::allocator<IPStatsRecord_*>::~allocator(&local_41);
    sStack_60 = 0;
    record._4_4_ = 0;
    while( true ) {
      uVar1 = BinHash<IPStatsRecord>::GetSize(&this->ip_records);
      if (uVar1 <= record._4_4_) break;
      for (local_70 = BinHash<IPStatsRecord>::GetEntry(&this->ip_records,record._4_4_);
          local_70 != (IPStatsRecord *)0x0; local_70 = local_70->HashNext) {
        ppIVar2 = std::vector<IPStatsRecord_*,_std::allocator<IPStatsRecord_*>_>::operator[]
                            ((vector<IPStatsRecord_*,_std::allocator<IPStatsRecord_*>_> *)local_40,
                             sStack_60);
        *ppIVar2 = local_70;
        sStack_60 = sStack_60 + 1;
      }
      record._4_4_ = record._4_4_ + 1;
    }
    __first = std::vector<IPStatsRecord_*,_std::allocator<IPStatsRecord_*>_>::begin
                        ((vector<IPStatsRecord_*,_std::allocator<IPStatsRecord_*>_> *)local_40);
    __last = std::vector<IPStatsRecord_*,_std::allocator<IPStatsRecord_*>_>::end
                       ((vector<IPStatsRecord_*,_std::allocator<IPStatsRecord_*>_> *)local_40);
    std::
    sort<__gnu_cxx::__normal_iterator<IPStatsRecord**,std::vector<IPStatsRecord*,std::allocator<IPStatsRecord*>>>,bool(*)(IPStatsRecord*,IPStatsRecord*)>
              ((__normal_iterator<IPStatsRecord_**,_std::vector<IPStatsRecord_*,_std::allocator<IPStatsRecord_*>_>_>
                )__first._M_current,
               (__normal_iterator<IPStatsRecord_**,_std::vector<IPStatsRecord_*,_std::allocator<IPStatsRecord_*>_>_>
                )__last._M_current,IPAddressIsLower);
    local_88 = 0;
    while( true ) {
      sVar3 = std::vector<IPStatsRecord_*,_std::allocator<IPStatsRecord_*>_>::size
                        ((vector<IPStatsRecord_*,_std::allocator<IPStatsRecord_*>_> *)local_40);
      if (sVar3 <= local_88) break;
      ppIVar2 = std::vector<IPStatsRecord_*,_std::allocator<IPStatsRecord_*>_>::operator[]
                          ((vector<IPStatsRecord_*,_std::allocator<IPStatsRecord_*>_> *)local_40,
                           local_88);
      IPStatsRecord::WriteRecord
                (*ppIVar2,(FILE *)records.
                                  super__Vector_base<IPStatsRecord_*,_std::allocator<IPStatsRecord_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      local_88 = local_88 + 1;
    }
    fclose((FILE *)records.super__Vector_base<IPStatsRecord_*,_std::allocator<IPStatsRecord_*>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage);
    std::vector<IPStatsRecord_*,_std::allocator<IPStatsRecord_*>_>::~vector
              ((vector<IPStatsRecord_*,_std::allocator<IPStatsRecord_*>_> *)local_40);
  }
  return (bool)(F._7_1_ & 1);
}

Assistant:

bool IPStats::SaveToCsv(char const* file_name)
{
    bool ret = true;
    int last_err = 0;
    FILE* F = ithi_file_open_ex(file_name, "wt", &last_err);

    if (F == NULL) {
        ret = false;
    }
    else {
        /* Enumerate the records in the binhash, store the keys in a vector */
        std::vector<IPStatsRecord*> records(ip_records.GetCount());
        size_t record_index = 0;

        for (uint32_t i = 0; i < ip_records.GetSize(); i++)
        {
            IPStatsRecord* record = ip_records.GetEntry(i);

            while (record != NULL) {
                records[record_index] = record;
                record_index++;
                record = record->HashNext;
            }
        }
        /* Sort the records by IP addresses */
        std::sort(records.begin(), records.end(), IPAddressIsLower);
        /* print the records to the file */
        for (size_t i = 0; i < records.size(); i++) {
            records[i]->WriteRecord(F);
        }
        /* Close the file */
        fclose(F);
    }

    return ret;
}